

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O2

void __thiscall higan::MultiplexEpoll::~MultiplexEpoll(MultiplexEpoll *this)

{
  (this->super_MultiplexBase)._vptr_MultiplexBase = (_func_int **)&PTR_UpdateChannel_00136bb0;
  close(this->epollfd_);
  std::_Vector_base<epoll_event,_std::allocator<epoll_event>_>::~_Vector_base
            (&(this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>);
  MultiplexBase::~MultiplexBase(&this->super_MultiplexBase);
  return;
}

Assistant:

MultiplexEpoll::~MultiplexEpoll()
{
	close(epollfd_);
}